

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::descriptor_unittest::ValidationErrorTest_DisallowEnumAlias_Test::TestBody
          (ValidationErrorTest_DisallowEnumAlias_Test *this)

{
  int value;
  Arg *in_R8;
  string_view format;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_118;
  Arg local_100;
  basic_string_view<char,_std::char_traits<char>_> local_d0;
  string local_c0;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_a0
  ;
  allocator<char> local_81;
  string local_80;
  Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> local_60
  ;
  allocator<char> local_31;
  string local_30;
  ValidationErrorTest_DisallowEnumAlias_Test *local_10;
  ValidationErrorTest_DisallowEnumAlias_Test *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,
             "name: \"foo.proto\" enum_type {  name: \"Bar\"  value { name:\"ENUM_A\" number:0 }  value { name:\"ENUM_B\" number:0 }}"
             ,&local_31);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_60,
            "foo.proto: Bar: NUMBER: \"ENUM_B\" uses the same enum value as \"ENUM_A\". If this is intended, set \'option allow_alias = true;\' to the enum definition. The next available enum value is 1.\n"
           );
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_30,&local_60);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_60);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_80,
             "\n        name: \"foo.proto\"\n        enum_type {\n          name: \"Bar\"\n          value { name: \"ENUM_A\" number: 10 }\n          value { name: \"ENUM_B\" number: 10 }\n          value { name: \"ENUM_C\" number: 11 }\n          value { name: \"ENUM_D\" number: 20 }\n        }"
             ,&local_81);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_a0,
            "foo.proto: Bar: NUMBER: \"ENUM_B\" uses the same enum value as \"ENUM_A\". If this is intended, set \'option allow_alias = true;\' to the enum definition. The next available enum value is 12.\n"
           );
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_80,&local_a0);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_a0);
  std::__cxx11::string::~string((string *)&local_80);
  std::allocator<char>::~allocator(&local_81);
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_d0,
             "\n                         name: \"foo.proto\"\n                         enum_type {\n                           name: \"Bar\"\n                           value { name: \"ENUM_A\" number: $0 }\n                           value { name: \"ENUM_B\" number: $0 }\n                         }"
            );
  value = std::numeric_limits<int>::max();
  absl::lts_20250127::substitute_internal::Arg::Arg(&local_100,value);
  format._M_str = (char *)&local_100;
  format._M_len = (size_t)local_d0._M_str;
  absl::lts_20250127::Substitute_abi_cxx11_(&local_c0,(lts_20250127 *)local_d0._M_len,format,in_R8);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::Matcher(&local_118,
            "foo.proto: Bar: NUMBER: \"ENUM_B\" uses the same enum value as \"ENUM_A\". If this is intended, set \'option allow_alias = true;\' to the enum definition.\n"
           );
  ValidationErrorTest::BuildFileWithErrors(&this->super_ValidationErrorTest,&local_c0,&local_118);
  testing::Matcher<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::~Matcher(&local_118);
  std::__cxx11::string::~string((string *)&local_c0);
  return;
}

Assistant:

TEST_F(ValidationErrorTest, DisallowEnumAlias) {
  BuildFileWithErrors(
      "name: \"foo.proto\" "
      "enum_type {"
      "  name: \"Bar\""
      "  value { name:\"ENUM_A\" number:0 }"
      "  value { name:\"ENUM_B\" number:0 }"
      "}",
      "foo.proto: Bar: NUMBER: "
      "\"ENUM_B\" uses the same enum value as \"ENUM_A\". "
      "If this is intended, set 'option allow_alias = true;' to the enum "
      "definition. The next available enum value is 1.\n");

  BuildFileWithErrors(
      R"pb(
        name: "foo.proto"
        enum_type {
          name: "Bar"
          value { name: "ENUM_A" number: 10 }
          value { name: "ENUM_B" number: 10 }
          value { name: "ENUM_C" number: 11 }
          value { name: "ENUM_D" number: 20 }
        })pb",
      "foo.proto: Bar: NUMBER: "
      "\"ENUM_B\" uses the same enum value as \"ENUM_A\". "
      "If this is intended, set 'option allow_alias = true;' to the enum "
      "definition. The next available enum value is 12.\n");

  BuildFileWithErrors(
      absl::Substitute(R"pb(
                         name: "foo.proto"
                         enum_type {
                           name: "Bar"
                           value { name: "ENUM_A" number: $0 }
                           value { name: "ENUM_B" number: $0 }
                         })pb",
                       std::numeric_limits<int32_t>::max()),
      "foo.proto: Bar: NUMBER: "
      "\"ENUM_B\" uses the same enum value as \"ENUM_A\". "
      "If this is intended, set 'option allow_alias = true;' to the enum "
      "definition.\n");
}